

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIImage::draw(CGUIImage *this)

{
  int iVar1;
  dimension2d<unsigned_int> *other;
  CGUIImage *in_RDI;
  rect<int> clippingRect_2;
  rect<int> clippingRect_1;
  rect<int> clippingRect;
  SColor Colors [4];
  rect<int> sourceRect;
  IVideoDriver *driver;
  IGUISkin *skin;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  rect<int> *in_stack_ffffffffffffff50;
  long *plVar2;
  rect<int> *in_stack_ffffffffffffff58;
  rect<int> *this_00;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  rect<int> local_78;
  undefined8 local_68;
  undefined8 local_60;
  u32 local_58;
  u32 local_54;
  u32 local_50;
  u32 local_4c;
  dimension2d<int> local_40;
  vector2d<int> local_38;
  vector2d<int> local_30;
  rect<int> local_28;
  long *local_18;
  long *local_10;
  
  if ((in_RDI->field_0xa0 & 1) != 0) {
    local_10 = (long *)(**(code **)(**(long **)&in_RDI->field_0x128 + 0x60))();
    local_18 = (long *)(**(code **)(**(long **)&in_RDI->field_0x128 + 0x30))();
    if (in_RDI->Texture == (ITexture *)0x0) {
      if ((in_RDI->DrawBackground & 1U) != 0) {
        local_94 = (undefined4)*(undefined8 *)&in_RDI->field_0x50;
        in_stack_ffffffffffffff70 = (undefined4)((ulong)*(undefined8 *)&in_RDI->field_0x50 >> 0x20);
        in_stack_ffffffffffffff74 = (undefined4)*(undefined8 *)&in_RDI->field_0x58;
        checkBounds(in_RDI,in_stack_ffffffffffffff58);
        plVar2 = local_10;
        local_98 = (**(code **)*local_10)(local_10,0);
        (**(code **)(*plVar2 + 0xa8))(plVar2,in_RDI,&local_98,&in_RDI->field_0x40,&local_94);
      }
    }
    else {
      local_28.UpperLeftCorner = (in_RDI->SourceRect).UpperLeftCorner;
      local_28.LowerRightCorner = (in_RDI->SourceRect).LowerRightCorner;
      iVar1 = core::rect<int>::getWidth(&local_28);
      if ((iVar1 == 0) || (iVar1 = core::rect<int>::getHeight(&local_28), iVar1 == 0)) {
        other = video::ITexture::getOriginalSize(in_RDI->Texture);
        core::dimension2d<int>::dimension2d<unsigned_int>(&local_40,other);
        core::rect<int>::rect<int>
                  (in_stack_ffffffffffffff50,
                   (dimension2d<int> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                  );
        local_28.UpperLeftCorner = local_38;
        local_28.LowerRightCorner = local_30;
      }
      if ((in_RDI->ScaleImage & 1U) == 0) {
        this_00 = (rect<int> *)&in_RDI->field_0x40;
        core::rect<int>::getSize(this_00);
        core::rect<int>::rect<int>
                  (in_stack_ffffffffffffff50,
                   (vector2d<int> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (dimension2d<int> *)0x3bfdcb);
        checkBounds(in_RDI,this_00);
        core::rect<int>::clipAgainst(&local_78,(rect<int> *)&in_RDI->field_0x50);
        (**(code **)(*local_18 + 0x180))
                  (local_18,in_RDI->Texture,&in_RDI->field_0x40,&local_28,&local_78,
                   (in_RDI->Color).color,in_RDI->UseAlphaChannel & 1);
      }
      else {
        local_58 = (in_RDI->Color).color;
        local_54 = (in_RDI->Color).color;
        local_50 = (in_RDI->Color).color;
        local_4c = (in_RDI->Color).color;
        local_68 = *(undefined8 *)&in_RDI->field_0x50;
        local_60 = *(undefined8 *)&in_RDI->field_0x58;
        checkBounds(in_RDI,in_stack_ffffffffffffff58);
        (**(code **)(*local_18 + 400))
                  (local_18,in_RDI->Texture,&in_RDI->field_0x40,&local_28,&local_68,&local_58,
                   in_RDI->UseAlphaChannel & 1);
      }
    }
    IGUIElement::draw((IGUIElement *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  return;
}

Assistant:

void CGUIImage::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	if (Texture) {
		core::rect<s32> sourceRect(SourceRect);
		if (sourceRect.getWidth() == 0 || sourceRect.getHeight() == 0) {
			sourceRect = core::rect<s32>(core::dimension2di(Texture->getOriginalSize()));
		}

		if (ScaleImage) {
			const video::SColor Colors[] = {Color, Color, Color, Color};

			core::rect<s32> clippingRect(AbsoluteClippingRect);
			checkBounds(clippingRect);

			driver->draw2DImage(Texture, AbsoluteRect, sourceRect,
					&clippingRect, Colors, UseAlphaChannel);
		} else {
			core::rect<s32> clippingRect(AbsoluteRect.UpperLeftCorner, sourceRect.getSize());
			checkBounds(clippingRect);
			clippingRect.clipAgainst(AbsoluteClippingRect);

			driver->draw2DImage(Texture, AbsoluteRect.UpperLeftCorner, sourceRect,
					&clippingRect, Color, UseAlphaChannel);
		}
	} else if (DrawBackground) {
		core::rect<s32> clippingRect(AbsoluteClippingRect);
		checkBounds(clippingRect);

		skin->draw2DRectangle(this, skin->getColor(EGDC_3D_DARK_SHADOW), AbsoluteRect, &clippingRect);
	}

	IGUIElement::draw();
}